

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O3

SockData * AGSSock::SockData_CreateEmpty(void)

{
  SockData *pSVar1;
  
  pSVar1 = (SockData *)operator_new(0x20);
  (pSVar1->data)._M_dataplus._M_p = (pointer)&(pSVar1->data).field_2;
  (pSVar1->data)._M_string_length = 0;
  (pSVar1->data).field_2._M_local_buf[0] = '\0';
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,pSVar1,&agsSockData);
  return pSVar1;
}

Assistant:

SockData *SockData_CreateEmpty()
{
	SockData *data = new SockData();
	AGS_OBJECT(SockData, data);
	return data;
}